

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImDrawList::UpdateClipRect(ImDrawList *this)

{
  int iVar1;
  uint uVar2;
  ImDrawCmd *pIVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  ImVec4 *pIVar13;
  ImDrawCmd *pIVar14;
  long lVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  ImTextureID pvVar19;
  void *pvVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined4 uStack_28;
  undefined4 uStack_24;
  ImVec4 curr_clip_rect;
  
  lVar15 = (long)(this->_ClipRectStack).Size;
  pIVar13 = (this->_ClipRectStack).Data + lVar15 + -1;
  if (lVar15 == 0) {
    pIVar13 = &this->_Data->ClipRectFullscreen;
  }
  uVar6 = pIVar13->x;
  uVar7 = pIVar13->y;
  uVar8 = pIVar13->z;
  uVar9 = pIVar13->w;
  iVar17 = (this->CmdBuffer).Size;
  lVar15 = (long)iVar17;
  pIVar3 = (this->CmdBuffer).Data;
  if (pIVar3 + lVar15 + -1 != (ImDrawCmd *)0x0 && 0 < lVar15) {
    uVar2 = pIVar3[lVar15 + -1].ElemCount;
    curr_clip_rect.x._0_1_ = (char)uVar6;
    curr_clip_rect.x._1_1_ = (char)((uint)uVar6 >> 8);
    curr_clip_rect.x._2_1_ = (char)((uint)uVar6 >> 0x10);
    curr_clip_rect.x._3_1_ = (char)((uint)uVar6 >> 0x18);
    curr_clip_rect.y._0_1_ = (char)uVar7;
    curr_clip_rect.y._1_1_ = (char)((uint)uVar7 >> 8);
    curr_clip_rect.y._2_1_ = (char)((uint)uVar7 >> 0x10);
    curr_clip_rect.y._3_1_ = (char)((uint)uVar7 >> 0x18);
    curr_clip_rect.z._0_1_ = (char)uVar8;
    curr_clip_rect.z._1_1_ = (char)((uint)uVar8 >> 8);
    curr_clip_rect.z._2_1_ = (char)((uint)uVar8 >> 0x10);
    curr_clip_rect.z._3_1_ = (char)((uint)uVar8 >> 0x18);
    curr_clip_rect.w._0_1_ = (char)uVar9;
    curr_clip_rect.w._1_1_ = (char)((uint)uVar9 >> 8);
    curr_clip_rect.w._2_1_ = (char)((uint)uVar9 >> 0x10);
    curr_clip_rect.w._3_1_ = (char)((uint)uVar9 >> 0x18);
    if (((uVar2 == 0) ||
        (auVar21[0] = -(*(char *)&pIVar3[lVar15 + -1].ClipRect.x == curr_clip_rect.x._0_1_),
        auVar21[1] = -(*(char *)((long)&pIVar3[lVar15 + -1].ClipRect.x + 1) ==
                      curr_clip_rect.x._1_1_),
        auVar21[2] = -(*(char *)((long)&pIVar3[lVar15 + -1].ClipRect.x + 2) ==
                      curr_clip_rect.x._2_1_),
        auVar21[3] = -(*(char *)((long)&pIVar3[lVar15 + -1].ClipRect.x + 3) ==
                      curr_clip_rect.x._3_1_),
        auVar21[4] = -(*(char *)&pIVar3[lVar15 + -1].ClipRect.y == curr_clip_rect.y._0_1_),
        auVar21[5] = -(*(char *)((long)&pIVar3[lVar15 + -1].ClipRect.y + 1) ==
                      curr_clip_rect.y._1_1_),
        auVar21[6] = -(*(char *)((long)&pIVar3[lVar15 + -1].ClipRect.y + 2) ==
                      curr_clip_rect.y._2_1_),
        auVar21[7] = -(*(char *)((long)&pIVar3[lVar15 + -1].ClipRect.y + 3) ==
                      curr_clip_rect.y._3_1_),
        auVar21[8] = -(*(char *)&pIVar3[lVar15 + -1].ClipRect.z == curr_clip_rect.z._0_1_),
        auVar21[9] = -(*(char *)((long)&pIVar3[lVar15 + -1].ClipRect.z + 1) ==
                      curr_clip_rect.z._1_1_),
        auVar21[10] = -(*(char *)((long)&pIVar3[lVar15 + -1].ClipRect.z + 2) ==
                       curr_clip_rect.z._2_1_),
        auVar21[0xb] = -(*(char *)((long)&pIVar3[lVar15 + -1].ClipRect.z + 3) ==
                        curr_clip_rect.z._3_1_),
        auVar21[0xc] = -(*(char *)&pIVar3[lVar15 + -1].ClipRect.w == curr_clip_rect.w._0_1_),
        auVar21[0xd] = -(*(char *)((long)&pIVar3[lVar15 + -1].ClipRect.w + 1) ==
                        curr_clip_rect.w._1_1_),
        auVar21[0xe] = -(*(char *)((long)&pIVar3[lVar15 + -1].ClipRect.w + 2) ==
                        curr_clip_rect.w._2_1_),
        auVar21[0xf] = -(*(char *)((long)&pIVar3[lVar15 + -1].ClipRect.w + 3) ==
                        curr_clip_rect.w._3_1_),
        (ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) | (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe | (ushort)(auVar21[0xf] >> 7) << 0xf
                ) == 0xffff)) && (pIVar3[lVar15 + -1].UserCallback == (ImDrawCallback)0x0)) {
      if (((1 < iVar17) && (uVar2 == 0)) &&
         (auVar22[0] = -(*(char *)&pIVar3[lVar15 + -2].ClipRect.x == curr_clip_rect.x._0_1_),
         auVar22[1] = -(*(char *)((long)&pIVar3[lVar15 + -2].ClipRect.x + 1) ==
                       curr_clip_rect.x._1_1_),
         auVar22[2] = -(*(char *)((long)&pIVar3[lVar15 + -2].ClipRect.x + 2) ==
                       curr_clip_rect.x._2_1_),
         auVar22[3] = -(*(char *)((long)&pIVar3[lVar15 + -2].ClipRect.x + 3) ==
                       curr_clip_rect.x._3_1_),
         auVar22[4] = -(*(char *)&pIVar3[lVar15 + -2].ClipRect.y == curr_clip_rect.y._0_1_),
         auVar22[5] = -(*(char *)((long)&pIVar3[lVar15 + -2].ClipRect.y + 1) ==
                       curr_clip_rect.y._1_1_),
         auVar22[6] = -(*(char *)((long)&pIVar3[lVar15 + -2].ClipRect.y + 2) ==
                       curr_clip_rect.y._2_1_),
         auVar22[7] = -(*(char *)((long)&pIVar3[lVar15 + -2].ClipRect.y + 3) ==
                       curr_clip_rect.y._3_1_),
         auVar22[8] = -(*(char *)&pIVar3[lVar15 + -2].ClipRect.z == curr_clip_rect.z._0_1_),
         auVar22[9] = -(*(char *)((long)&pIVar3[lVar15 + -2].ClipRect.z + 1) ==
                       curr_clip_rect.z._1_1_),
         auVar22[10] = -(*(char *)((long)&pIVar3[lVar15 + -2].ClipRect.z + 2) ==
                        curr_clip_rect.z._2_1_),
         auVar22[0xb] = -(*(char *)((long)&pIVar3[lVar15 + -2].ClipRect.z + 3) ==
                         curr_clip_rect.z._3_1_),
         auVar22[0xc] = -(*(char *)&pIVar3[lVar15 + -2].ClipRect.w == curr_clip_rect.w._0_1_),
         auVar22[0xd] = -(*(char *)((long)&pIVar3[lVar15 + -2].ClipRect.w + 1) ==
                         curr_clip_rect.w._1_1_),
         auVar22[0xe] = -(*(char *)((long)&pIVar3[lVar15 + -2].ClipRect.w + 2) ==
                         curr_clip_rect.w._2_1_),
         auVar22[0xf] = -(*(char *)((long)&pIVar3[lVar15 + -2].ClipRect.w + 3) ==
                         curr_clip_rect.w._3_1_),
         (ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) | (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1
                  | (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe |
                 (ushort)(auVar22[0xf] >> 7) << 0xf) == 0xffff)) {
        lVar18 = (long)(this->_TextureIdStack).Size;
        if (lVar18 == 0) {
          pvVar19 = (ImTextureID)0x0;
        }
        else {
          pvVar19 = (this->_TextureIdStack).Data[lVar18 + -1];
        }
        if ((pIVar3[lVar15 + -2].TextureId == pvVar19) &&
           (pIVar3[lVar15 + -2].UserCallback == (ImDrawCallback)0x0)) {
          (this->CmdBuffer).Size = iVar17 + -1;
          return;
        }
      }
      fVar10 = pIVar13->y;
      fVar11 = pIVar13->z;
      fVar12 = pIVar13->w;
      pIVar3[lVar15 + -1].ClipRect.x = pIVar13->x;
      pIVar3[lVar15 + -1].ClipRect.y = fVar10;
      pIVar3[lVar15 + -1].ClipRect.z = fVar11;
      pIVar3[lVar15 + -1].ClipRect.w = fVar12;
      return;
    }
  }
  lVar15 = (long)(this->_ClipRectStack).Size;
  pIVar13 = (this->_ClipRectStack).Data + lVar15 + -1;
  if (lVar15 == 0) {
    pIVar13 = &this->_Data->ClipRectFullscreen;
  }
  lVar15._0_4_ = pIVar13->x;
  lVar15._4_4_ = pIVar13->y;
  uVar4 = pIVar13->z;
  uVar5 = pIVar13->w;
  lVar18 = (long)(this->_TextureIdStack).Size;
  if (lVar18 == 0) {
    pvVar20 = (void *)0x0;
  }
  else {
    pvVar20 = (this->_TextureIdStack).Data[lVar18 + -1];
  }
  iVar17 = (this->CmdBuffer).Size;
  iVar1 = (this->CmdBuffer).Capacity;
  if (iVar17 == iVar1) {
    iVar17 = iVar17 + 1;
    if (iVar1 == 0) {
      iVar16 = 8;
    }
    else {
      iVar16 = iVar1 / 2 + iVar1;
    }
    if (iVar17 < iVar16) {
      iVar17 = iVar16;
    }
    if (iVar1 < iVar17) {
      pIVar14 = (ImDrawCmd *)ImGui::MemAlloc((long)iVar17 * 0x30);
      pIVar3 = (this->CmdBuffer).Data;
      if (pIVar3 != (ImDrawCmd *)0x0) {
        memcpy(pIVar14,pIVar3,(long)(this->CmdBuffer).Size * 0x30);
        ImGui::MemFree((this->CmdBuffer).Data);
      }
      (this->CmdBuffer).Data = pIVar14;
      (this->CmdBuffer).Capacity = iVar17;
    }
  }
  pIVar14 = (this->CmdBuffer).Data;
  iVar17 = (this->CmdBuffer).Size;
  *(ulong *)&pIVar14[iVar17].ClipRect.w = CONCAT44(uStack_24,uVar5);
  pIVar3 = pIVar14 + iVar17;
  pIVar3->ElemCount = (int)(lVar15 << 0x20);
  (pIVar3->ClipRect).x = (float)(int)((ulong)(lVar15 << 0x20) >> 0x20);
  (pIVar3->ClipRect).y = (float)lVar15._4_4_;
  (pIVar3->ClipRect).z = (float)uVar4;
  pIVar14[iVar17].TextureId = pvVar20;
  pIVar14[iVar17].UserCallback = (ImDrawCallback)0x0;
  (&pIVar14[iVar17].UserCallback)[1] = (ImDrawCallback)0x0;
  (this->CmdBuffer).Size = (this->CmdBuffer).Size + 1;
  return;
}

Assistant:

void ImDrawList::UpdateClipRect()
{
    // If current command is used with different settings we need to add a new command
    const ImVec4 curr_clip_rect = GetCurrentClipRect();
    ImDrawCmd* curr_cmd = CmdBuffer.Size > 0 ? &CmdBuffer.Data[CmdBuffer.Size-1] : NULL;
    if (!curr_cmd || (curr_cmd->ElemCount != 0 && memcmp(&curr_cmd->ClipRect, &curr_clip_rect, sizeof(ImVec4)) != 0) || curr_cmd->UserCallback != NULL)
    {
        AddDrawCmd();
        return;
    }

    // Try to merge with previous command if it matches, else use current command
    ImDrawCmd* prev_cmd = CmdBuffer.Size > 1 ? curr_cmd - 1 : NULL;
    if (curr_cmd->ElemCount == 0 && prev_cmd && memcmp(&prev_cmd->ClipRect, &curr_clip_rect, sizeof(ImVec4)) == 0 && prev_cmd->TextureId == GetCurrentTextureId() && prev_cmd->UserCallback == NULL)
        CmdBuffer.pop_back();
    else
        curr_cmd->ClipRect = curr_clip_rect;
}